

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O1

bool handleGetBulkRequestPDU
               (deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
               deque<VarBind,_std::allocator<VarBind>_> *varbindList,
               deque<VarBind,_std::allocator<VarBind>_> *outResponseList,uint nonRepeaters,
               uint maxRepititions)

{
  ASN_TYPE *pAVar1;
  _Map_pointer ppVVar2;
  undefined8 this;
  undefined8 uVar3;
  SortableOIDType *pSVar4;
  _Alloc_hider callbacks_00;
  uint uVar5;
  reference pVVar6;
  ValueCallback *pVVar7;
  undefined4 in_register_0000000c;
  uint i;
  ulong uVar8;
  bool bVar9;
  shared_ptr<BER_CONTAINER> value;
  shared_ptr<BER_CONTAINER> value_1;
  size_t foundAt;
  undefined1 local_98 [24];
  _Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *local_80;
  uint local_74;
  undefined1 local_70 [24];
  OIDType *local_58;
  SortableOIDType *pSStack_50;
  int local_48;
  _Alloc_hider local_40;
  size_t local_38;
  
  register0x0000000c = in_register_0000000c;
  local_48 = nonRepeaters;
  local_70._16_8_ = ZEXT48(nonRepeaters);
  local_98._16_8_ = outResponseList;
  local_74 = maxRepititions;
  local_40._M_p = (pointer)callbacks;
  if (nonRepeaters != 0) {
    local_80 = &(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                super__Deque_impl_data._M_start;
    uVar8 = 0;
    do {
      ppVVar2 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      if (((long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
          ((long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
          (((long)ppVVar2 -
            (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppVVar2 == (_Map_pointer)0x0)) * 10 <= uVar8) break;
      pVVar6 = std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator[](local_80,uVar8);
      pVVar7 = ValueCallback::findCallback
                         ((deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *)local_40._M_p,
                          (pVVar6->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,true,0,(size_t *)0x0);
      if (pVVar7 == (ValueCallback *)0x0) {
        local_98._0_8_ = (element_type *)0x0;
        local_98._8_8_ = operator_new(0x20);
        (((SortableOIDType *)local_98._8_8_)->super_OIDType).super_BER_CONTAINER._type = 1;
        (((SortableOIDType *)local_98._8_8_)->super_OIDType).super_BER_CONTAINER._length = 1;
        (((SortableOIDType *)local_98._8_8_)->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER
             = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115910;
        local_98._0_8_ = &(((SortableOIDType *)local_98._8_8_)->super_OIDType).valid;
        *(undefined ***)&(((SortableOIDType *)local_98._8_8_)->super_OIDType).valid =
             &PTR__BER_CONTAINER_00114f80;
        (((SortableOIDType *)local_98._8_8_)->super_OIDType)._value._M_dataplus._M_p = (pointer)0x82
        ;
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                  ((deque<VarBind,std::allocator<VarBind>> *)local_98._16_8_,pVVar6,
                   (shared_ptr<ImplicitNullType> *)local_98);
      }
      else {
        ValueCallback::getValueForCallback((ValueCallback *)local_98,pVVar7);
        if ((element_type *)local_98._0_8_ == (element_type *)0x0) {
          local_70._0_4_ = 5;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    ((deque<VarBind,std::allocator<VarBind>> *)local_98._16_8_,&pVVar7->OID,
                     (ERROR_STATUS_WITH_VALUE *)local_70);
        }
        else {
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<VarBind_const&,std::shared_ptr<BER_CONTAINER>&>
                    ((deque<VarBind,std::allocator<VarBind>> *)local_98._16_8_,pVVar6,
                     (shared_ptr<BER_CONTAINER> *)local_98);
        }
      }
      if ((SortableOIDType *)local_98._8_8_ != (SortableOIDType *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      }
      uVar8 = uVar8 + 1;
    } while (local_70._16_8_ != uVar8);
  }
  callbacks_00._M_p = local_40._M_p;
  ppVVar2 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  uVar8 = ((long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
          ((long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
          (((long)ppVVar2 -
            (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppVVar2 == (_Map_pointer)0x0)) * 10;
  if ((ulong)local_70._16_8_ < uVar8) {
    uVar5 = (int)uVar8 - local_48;
    local_80 = (_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)(ulong)uVar5;
    if (uVar5 != 0) {
      local_70._16_8_ =
           &(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
            super__Deque_impl_data._M_start;
      uVar8 = 0;
      do {
        pVVar6 = std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator[]
                           ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)local_70._16_8_,
                            (ulong)(uint)((int)uVar8 + (int)_local_48));
        local_98._0_8_ =
             (pVVar6->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98._8_8_ =
             (pVVar6->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if ((SortableOIDType *)local_98._8_8_ != (SortableOIDType *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pAVar1 = &(((SortableOIDType *)local_98._8_8_)->super_OIDType).super_BER_CONTAINER._type
            ;
            *pAVar1 = *pAVar1 + 1;
            UNLOCK();
          }
          else {
            pAVar1 = &(((SortableOIDType *)local_98._8_8_)->super_OIDType).super_BER_CONTAINER._type
            ;
            *pAVar1 = *pAVar1 + 1;
          }
        }
        local_38 = 0;
        if (local_74 != 0) {
          uVar5 = 1;
          while (pVVar7 = ValueCallback::findCallback
                                    ((deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *)
                                     callbacks_00._M_p,(OIDType *)local_98._0_8_,true,local_38,
                                     &local_38), pVVar7 != (ValueCallback *)0x0) {
            ValueCallback::getValueForCallback((ValueCallback *)local_70,pVVar7);
            uVar3 = local_70._0_8_;
            if ((bool *)local_70._0_8_ == (bool *)0x0) {
              local_58 = (OIDType *)CONCAT44(local_58._4_4_,5);
              std::deque<VarBind,std::allocator<VarBind>>::
              emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                        ((deque<VarBind,std::allocator<VarBind>> *)local_98._16_8_,&pVVar7->OID,
                         (ERROR_STATUS_WITH_VALUE *)&local_58);
            }
            else {
              std::deque<VarBind,std::allocator<VarBind>>::
              emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                        ((deque<VarBind,std::allocator<VarBind>> *)local_98._16_8_,&pVVar7->OID,
                         (shared_ptr<BER_CONTAINER> *)local_70);
              OIDType::cloneOID((OIDType *)&local_58);
              pSVar4 = pSStack_50;
              local_98._0_8_ = local_58;
              this = local_98._8_8_;
              local_58 = (element_type *)0x0;
              pSStack_50 = (SortableOIDType *)0x0;
              local_98._8_8_ = pSVar4;
              if ((SortableOIDType *)this != (SortableOIDType *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
              }
              if (pSStack_50 != (SortableOIDType *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_50);
              }
            }
            if ((SortableOIDType *)local_70._8_8_ != (SortableOIDType *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
            }
            if (((bool *)uVar3 == (bool *)0x0) ||
               (bVar9 = local_74 <= uVar5, uVar5 = uVar5 + 1, bVar9)) goto LAB_00109a24;
          }
          local_70._0_8_ = (_func_int **)0x0;
          local_70._8_8_ = operator_new(0x20);
          (((SortableOIDType *)local_70._8_8_)->super_OIDType).super_BER_CONTAINER._type = 1;
          (((SortableOIDType *)local_70._8_8_)->super_OIDType).super_BER_CONTAINER._length = 1;
          (((SortableOIDType *)local_70._8_8_)->super_OIDType).super_BER_CONTAINER.
          _vptr_BER_CONTAINER = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115910;
          local_70._0_8_ = &(((SortableOIDType *)local_70._8_8_)->super_OIDType).valid;
          *(undefined ***)&(((SortableOIDType *)local_70._8_8_)->super_OIDType).valid =
               &PTR__BER_CONTAINER_00114f80;
          (((SortableOIDType *)local_70._8_8_)->super_OIDType)._value._M_dataplus._M_p =
               (pointer)0x82;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<std::shared_ptr<OIDType>&,std::shared_ptr<ImplicitNullType>>
                    ((deque<VarBind,std::allocator<VarBind>> *)local_98._16_8_,
                     (shared_ptr<OIDType> *)local_98,(shared_ptr<ImplicitNullType> *)local_70);
          if ((SortableOIDType *)local_70._8_8_ != (SortableOIDType *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
          }
        }
LAB_00109a24:
        if ((SortableOIDType *)local_98._8_8_ != (SortableOIDType *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        uVar8 = uVar8 + 1;
      } while ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)uVar8 != local_80);
    }
  }
  return true;
}

Assistant:

bool handleGetBulkRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, unsigned int nonRepeaters, unsigned int maxRepititions){
    // from https://tools.ietf.org/html/rfc1448#page-18
    SNMP_LOGD("handleGetBulkRequestPDU, nonRepeaters:%d, maxRepititions:%d, varbindSize:%ld\n", nonRepeaters, maxRepititions, varbindList.size());
    // nonRepeaters is MIN(nonRepeaters, varbindList.size()
    // repeaters is the extra of varbindList.size() - nonRepeaters) which get 'walked' maxRepititions times

    SNMP_LOGD("handling nonRepeaters\n");
    if(nonRepeaters > 0){
        // handle GET normally, but mark endOfMibView if not found
        for(unsigned int i = 0; i < nonRepeaters && i < varbindList.size(); i++){
            const VarBind& requestVarBind = varbindList[i];
            ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), true);
            if(!callback){
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
                continue;
            }

            auto value = ValueCallback::getValueForCallback(callback);
            if(!value){
                SNMP_LOGD("Couldn't get value for callback\n");
                outResponseList.emplace_back(callback->OID, GEN_ERR);
                continue;   
            }
            outResponseList.emplace_back(requestVarBind, value);
        }
    }

    if(varbindList.size() > nonRepeaters){
        // For each extra varbind, WALK that tree until maxRepititions or endOfMibView
        SNMP_LOGD("handling repeaters\n");
        unsigned int repeatingVarBinds = varbindList.size() - nonRepeaters;
        
        for(unsigned int i = 0; i < repeatingVarBinds; i++){
            // Store first varbind to get for each line
            auto oid = varbindList[i+nonRepeaters].oid;
            size_t foundAt = 0;

            for(unsigned int j = 0; j < maxRepititions; j++){
                SNMP_LOGD("finding next callback for OID: %s\n", oid->string().c_str());
                ValueCallback* callback = ValueCallback::findCallback(callbacks, oid.get(), true, foundAt, &foundAt);
                if(!callback){
                    // We're done, mark endOfMibView
                    outResponseList.emplace_back(oid, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
                    break;
                }

                auto value = ValueCallback::getValueForCallback(callback);

                if(!value){
                    SNMP_LOGD("Couldn't get value for callback\n");
                    outResponseList.emplace_back(callback->OID, GEN_ERR);
                    break;   
                }
                
                outResponseList.emplace_back(callback->OID, value);

                // set next oid to callback OID
                oid = callback->OID->cloneOID();
            }

            //SNMP_LOGD("Walked tree of %s, %d times", (*varbindList)[i+nonRepeaters]->oid->_value, j);
        }
    }

    return true;
}